

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-example.cc
# Opt level: O1

string * __thiscall
ExprPrinter::OnUnary(string *__return_storage_ptr__,ExprPrinter *this,Kind kind,string *arg)

{
  char *local_10;
  
  if (kind == FIRST_UNARY) {
    format<std::__cxx11::string>(__return_storage_ptr__,this,"-{}",arg);
  }
  else {
    local_10 = mp::internal::ExprInfo::INFO[kind].str;
    format<char_const*,std::__cxx11::string>(__return_storage_ptr__,this,"{}({})",&local_10,arg);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string OnUnary(expr::Kind kind, std::string arg) {
    return kind == expr::MINUS ?
          format("-{}", arg) : format("{}({})", expr::str(kind), arg);
  }